

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::expr(GrpParser *this)

{
  ASTPair *in_RDI;
  ASTFactory *unaff_retaddr;
  ParserException *ex;
  RefAST expr_AST;
  ASTPair currentAST;
  GrpParser *in_stack_00000090;
  RefAST *other;
  ASTPair *in_stack_ffffffffffffffc0;
  RefCount<AST> *in_stack_ffffffffffffffc8;
  RefCount<AST> *in_stack_ffffffffffffffd0;
  RefAST *in_stack_fffffffffffffff0;
  ASTPair *currentAST_00;
  
  other = &nullAST;
  currentAST_00 = in_RDI;
  RefCount<AST>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ASTPair::ASTPair(in_stack_ffffffffffffffc0);
  RefCount<AST>::RefCount(&in_stack_ffffffffffffffc0->root,other);
  conditionalExpr(in_stack_00000090);
  RefCount<AST>::RefCount(&in_stack_ffffffffffffffc0->root,other);
  ASTFactory::addASTChild(unaff_retaddr,currentAST_00,in_stack_fffffffffffffff0);
  RefCount<AST>::~RefCount(&in_RDI->root);
  RefCount<AST>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  RefCount<AST>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  RefCount<AST>::~RefCount(&in_RDI->root);
  ASTPair::~ASTPair(in_RDI);
  return;
}

Assistant:

void GrpParser::expr() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST expr_AST = nullAST;
	
	try {      // for error handling
		conditionalExpr();
		astFactory.addASTChild(currentAST, returnAST);
		expr_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_8);
	}
	returnAST = expr_AST;
}